

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaAttributeGroupPtr_conflict
xmlSchemaParseAttributeGroupDefinition
          (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlChar *refTargetNs;
  _xmlAttr *p_Var1;
  xmlNodePtr pxVar2;
  xmlSchemaPtr schema_00;
  int iVar3;
  xmlAttrPtr pxVar4;
  xmlSchemaTypePtr attr;
  undefined4 extraout_var;
  xmlSchemaAttributeGroupPtr_conflict extraout_RAX;
  undefined8 *item;
  xmlSchemaRedefPtr_conflict pxVar5;
  undefined4 extraout_var_00;
  _xmlNode *p_Var6;
  undefined4 extraout_var_01;
  _xmlNode *extraout_RAX_00;
  _xmlNode *extraout_RAX_01;
  xmlSchemaAnnotPtr pxVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  xmlSchemaWildcardPtr pxVar8;
  _xmlNode *extraout_RAX_02;
  xmlNodePtr in_RCX;
  xmlSchemaTypePtr type;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlChar **in_R8;
  char *in_R9;
  xmlNodePtr child;
  int hasRefs;
  xmlChar *name;
  char *in_stack_ffffffffffffffa8;
  xmlNodePtr local_50;
  int local_44;
  xmlSchemaPtr local_40;
  xmlSchemaTypePtr local_38;
  
  local_50 = (xmlNodePtr)0x0;
  local_44 = 0;
  pxVar4 = xmlSchemaGetPropNode(node,"name");
  if (pxVar4 == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (pctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1cc054,in_RCX,(char *)in_R8,
               in_R9);
    return extraout_RAX;
  }
  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  type = (xmlSchemaTypePtr)&local_38;
  iVar3 = xmlSchemaPValAttrNode(pctxt,(xmlSchemaBasicItemPtr)pxVar4,(xmlAttrPtr)attr,type,in_R8);
  p_Var6 = (_xmlNode *)CONCAT44(extraout_var,iVar3);
  if (iVar3 != 0) {
    return (xmlSchemaAttributeGroupPtr_conflict)p_Var6;
  }
  if (local_38 != (xmlSchemaTypePtr)0x0) {
    refTargetNs = pctxt->targetNamespace;
    item = (undefined8 *)(*xmlMalloc)(0x78);
    if (item != (undefined8 *)0x0) {
      *item = 0;
      item[1] = 0;
      item[2] = 0;
      item[3] = 0;
      item[0xc] = 0;
      item[0xd] = 0;
      item[8] = 0;
      item[9] = 0;
      item[10] = 0;
      item[0xb] = 0;
      item[6] = 0;
      item[7] = 0;
      item[4] = 0;
      item[5] = 0;
      item[0xe] = 0;
      *(undefined4 *)item = 0x10;
      item[2] = local_38;
      item[0xd] = refTargetNs;
      item[8] = node;
      *(byte *)(item + 9) = *(byte *)(item + 9) | 2;
      if (pctxt->isRedefine != 0) {
        pxVar5 = xmlSchemaAddRedef(pctxt,pctxt->redefined,item,(xmlChar *)local_38,refTargetNs);
        pctxt->redef = pxVar5;
        if (pxVar5 == (xmlSchemaRedefPtr_conflict)0x0) {
          p_Var6 = (_xmlNode *)(*xmlFree)(item);
          type = local_38;
          goto LAB_00197726;
        }
        pctxt->redefCounter = 0;
        type = local_38;
      }
      iVar3 = xmlSchemaAddItemSize(&pctxt->constructor->bucket->globals,5,item);
      p_Var6 = (_xmlNode *)CONCAT44(extraout_var_00,iVar3);
      if (iVar3 < 0) {
        xmlSchemaPErrMemory(pctxt);
        p_Var6 = (_xmlNode *)(*xmlFree)(item);
        item = (undefined8 *)0x0;
      }
      if (item != (undefined8 *)0x0) {
        iVar3 = xmlSchemaAddItemSize(&pctxt->constructor->pending,10,item);
        p_Var6 = (_xmlNode *)CONCAT44(extraout_var_01,iVar3);
        if (iVar3 < 0) {
          xmlSchemaPErrMemory(pctxt);
          p_Var6 = extraout_RAX_00;
        }
      }
      goto LAB_00197729;
    }
    xmlSchemaPErrMemory(pctxt);
    p_Var6 = extraout_RAX_01;
  }
LAB_00197726:
  item = (undefined8 *)0x0;
LAB_00197729:
  if (item != (undefined8 *)0x0) {
    local_40 = schema;
    for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
      if (p_Var1->ns == (xmlNs *)0x0) {
        iVar3 = xmlStrEqual(p_Var1->name,"name");
        if ((iVar3 == 0) &&
           (iVar3 = xmlStrEqual(p_Var1->name,"id"), ownerComp = extraout_RDX_00, iVar3 == 0))
        goto LAB_00197767;
      }
      else {
        iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        ownerComp = extraout_RDX;
        if (iVar3 != 0) {
LAB_00197767:
          xmlSchemaPIllegalAttrErr(pctxt,(xmlParserErrors)p_Var1,ownerComp,(xmlAttrPtr)type);
        }
      }
    }
    pxVar4 = xmlSchemaGetPropNode(node,"id");
    if (pxVar4 != (xmlAttrPtr)0x0) {
      xmlSchemaPValAttrNodeID(pctxt,pxVar4);
    }
    schema_00 = local_40;
    pxVar2 = node->children;
    local_50 = pxVar2;
    if ((((pxVar2 != (xmlNodePtr)0x0) && (pxVar2->ns != (xmlNs *)0x0)) &&
        (iVar3 = xmlStrEqual(pxVar2->name,(xmlChar *)"annotation"), iVar3 != 0)) &&
       (iVar3 = xmlStrEqual(pxVar2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar3 != 0)) {
      pxVar7 = xmlSchemaParseAnnotation(pctxt,pxVar2,1);
      item[6] = pxVar7;
      local_50 = pxVar2->next;
    }
    iVar3 = xmlSchemaParseLocalAttributes
                      (pctxt,schema_00,&local_50,(xmlSchemaItemListPtr *)(item + 0xe),0x10,&local_44
                      );
    pxVar2 = local_50;
    p_Var6 = (_xmlNode *)CONCAT44(extraout_var_02,iVar3);
    if (local_44 != 0) {
      *(byte *)(item + 9) = *(byte *)(item + 9) | 0x10;
    }
    if (iVar3 != -1) {
      if ((local_50 != (xmlNodePtr)0x0) && (local_50->ns != (xmlNs *)0x0)) {
        iVar3 = xmlStrEqual(local_50->name,(xmlChar *)"anyAttribute");
        p_Var6 = (_xmlNode *)CONCAT44(extraout_var_03,iVar3);
        if (iVar3 != 0) {
          iVar3 = xmlStrEqual(pxVar2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          p_Var6 = (_xmlNode *)CONCAT44(extraout_var_04,iVar3);
          if (iVar3 != 0) {
            pxVar8 = xmlSchemaParseAnyAttribute(pctxt,schema_00,pxVar2);
            item[10] = pxVar8;
            p_Var6 = pxVar2->next;
            local_50 = p_Var6;
          }
        }
      }
      if (local_50 != (xmlNodePtr)0x0) {
        xmlSchemaPContentErr
                  (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,local_50,
                   (xmlNodePtr)0x0,"(annotation?, ((attribute | attributeGroup)*, anyAttribute?))",
                   in_stack_ffffffffffffffa8);
        p_Var6 = extraout_RAX_02;
      }
    }
  }
  return (xmlSchemaAttributeGroupPtr_conflict)p_Var6;
}

Assistant:

static xmlSchemaAttributeGroupPtr
xmlSchemaParseAttributeGroupDefinition(xmlSchemaParserCtxtPtr pctxt,
				       xmlSchemaPtr schema,
				       xmlNodePtr node)
{
    const xmlChar *name;
    xmlSchemaAttributeGroupPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int hasRefs = 0;
    int res;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "name");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(pctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "name", NULL);
	return (NULL);
    }
    /*
    * The name is crucial, exit if invalid.
    */
    if (xmlSchemaPValAttrNode(pctxt,
	NULL, attr,
	xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	return (NULL);
    }
    ret = xmlSchemaAddAttributeGroupDefinition(pctxt, schema,
	name, pctxt->targetNamespace, node);
    if (ret == NULL)
	return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id")))
	    {
		xmlSchemaPIllegalAttrErr(pctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(pctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    /* Attribute ID */
    xmlSchemaPValAttrID(pctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        ret->annot = xmlSchemaParseAnnotation(pctxt, child, 1);
        child = child->next;
    }
    /*
    * Parse contained attribute decls/refs.
    */
    res = xmlSchemaParseLocalAttributes(pctxt, schema, &child,
	(xmlSchemaItemListPtr *) &(ret->attrUses),
	XML_SCHEMA_TYPE_ATTRIBUTEGROUP, &hasRefs);
    if (hasRefs)
	ret->flags |= XML_SCHEMAS_ATTRGROUP_HAS_REFS;
    if (res == -1)
	return(NULL);
    /*
    * Parse the attribute wildcard.
    */
    if (IS_SCHEMA(child, "anyAttribute")) {
	ret->attributeWildcard = xmlSchemaParseAnyAttribute(pctxt,
	    schema, child);
	child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(pctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, ((attribute | attributeGroup)*, anyAttribute?))");
    }
    return (ret);
}